

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

void obx::internal::throwError(obx_err err,string *message)

{
  IllegalStateException *pIVar1;
  IllegalArgumentException *this;
  ShuttingDownException *this_00;
  MaxDataSizeExceededException *this_01;
  FeatureNotAvailableException *this_02;
  DbException *this_03;
  string local_38 [32];
  string *local_18;
  string *message_local;
  obx_err err_local;
  
  local_18 = message;
  message_local._4_4_ = err;
  if (err == 0) {
    pIVar1 = (IllegalStateException *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "No error occurred; operation was successful. Given message: ");
    IllegalStateException::runtime_error(pIVar1,local_38);
    __cxa_throw(pIVar1,&IllegalStateException::typeinfo,
                IllegalStateException::~IllegalStateException);
  }
  if (err == 0x2712) {
    this = (IllegalArgumentException *)__cxa_allocate_exception(0x10);
    IllegalArgumentException::runtime_error(this,local_18);
    __cxa_throw(this,&IllegalArgumentException::typeinfo,
                IllegalArgumentException::~IllegalArgumentException);
  }
  if (err == 0x2711) {
    pIVar1 = (IllegalStateException *)__cxa_allocate_exception(0x10);
    IllegalStateException::runtime_error(pIVar1,local_18);
    __cxa_throw(pIVar1,&IllegalStateException::typeinfo,
                IllegalStateException::~IllegalStateException);
  }
  if (err == 0x2716) {
    this_00 = (ShuttingDownException *)__cxa_allocate_exception(0x10);
    ShuttingDownException::runtime_error(this_00,local_18);
    __cxa_throw(this_00,&ShuttingDownException::typeinfo,
                ShuttingDownException::~ShuttingDownException);
  }
  if (err == 0x2778) {
    this_01 = (MaxDataSizeExceededException *)__cxa_allocate_exception(0x10);
    MaxDataSizeExceededException::runtime_error(this_01,local_18);
    __cxa_throw(this_01,&MaxDataSizeExceededException::typeinfo,
                MaxDataSizeExceededException::~MaxDataSizeExceededException);
  }
  if (err == 0x2715) {
    this_02 = (FeatureNotAvailableException *)__cxa_allocate_exception(0x10);
    FeatureNotAvailableException::runtime_error(this_02,local_18);
    __cxa_throw(this_02,&FeatureNotAvailableException::typeinfo,
                FeatureNotAvailableException::~FeatureNotAvailableException);
  }
  this_03 = (DbException *)__cxa_allocate_exception(0x18);
  DbException::DbException(this_03,local_18,message_local._4_4_);
  __cxa_throw(this_03,&DbException::typeinfo,DbException::~DbException);
}

Assistant:

[[noreturn]] void throwError(obx_err err, const std::string& message) {
    if (err == OBX_SUCCESS) {  // Zero, there's no error actually: this is atypical corner case, which should be avoided
        throw IllegalStateException("No error occurred; operation was successful. Given message: " + message);
    } else {
        if (err == OBX_ERROR_ILLEGAL_ARGUMENT) {
            throw IllegalArgumentException(message);
        } else if (err == OBX_ERROR_ILLEGAL_STATE) {
            throw IllegalStateException(message);
        } else if (err == OBX_ERROR_SHUTTING_DOWN) {
            throw ShuttingDownException(message);
        } else if (err == OBX_ERROR_MAX_DATA_SIZE_EXCEEDED) {
            throw MaxDataSizeExceededException(message);
        } else if (err == OBX_ERROR_FEATURE_NOT_AVAILABLE) {
            throw FeatureNotAvailableException(message);
        } else {
            throw DbException(message, err);
        }
    }
}